

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSGlue::emitPostES6(Wasm2JSGlue *this)

{
  Name *pNVar1;
  ExternalKind EVar2;
  _Head_base<0UL,_wasm::Function_*,_false> _Var3;
  Module *pMVar4;
  pointer puVar5;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var6;
  Export *pEVar7;
  long lVar8;
  bool bVar9;
  char cVar10;
  ostream *poVar11;
  size_type sVar12;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var13;
  __node_base_ptr p_Var14;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar15;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *import_1;
  pointer puVar16;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar17;
  long lVar18;
  IString name;
  IString name_00;
  IString name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  __ireturn_type _Var19;
  string local_278 [8];
  ostringstream export_name;
  string local_100 [32];
  string local_e0;
  string local_c0;
  undefined1 local_a0 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  string local_60;
  __node_base_ptr local_40;
  Module *local_38;
  
  _Var13._M_head_impl = (Memory *)this->wasm;
  if ((*(pointer *)((long)(_Var13._M_head_impl + 1) + 0x20) !=
       *(pointer *)((long)(_Var13._M_head_impl + 1) + 0x28)) &&
     (*(long *)((long)((*(pointer *)((long)(_Var13._M_head_impl + 1) + 0x20))->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false> + 0x20) != 0)) {
    poVar11 = std::operator<<((ostream *)(this->out + 0x200),"var mem");
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(this->moduleName).super_IString.str._M_str,
                         (this->moduleName).super_IString.str._M_len);
    poVar11 = std::operator<<(poVar11," = new ArrayBuffer(");
    _Var13._M_head_impl =
         *(Memory **)
          &(((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::operator<<(poVar11,");\n");
  }
  poVar11 = std::operator<<((ostream *)(this->out + 0x200),"var ret");
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  poVar11 = std::operator<<(poVar11," = ");
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  std::operator<<(poVar11,"({\n");
  local_a0 = (undefined1  [8])&seenModules._M_h._M_rehash_policy._M_next_resize;
  seenModules._M_h._M_buckets = (__buckets_ptr)0x1;
  seenModules._M_h._M_bucket_count = 0;
  seenModules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seenModules._M_h._M_element_count._0_4_ = 0x3f800000;
  seenModules._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seenModules._M_h._M_rehash_policy._4_4_ = 0;
  seenModules._M_h._M_rehash_policy._M_next_resize = 0;
  local_40 = (__node_base_ptr)
             (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pcVar15 = extraout_RDX;
  local_38 = (Module *)this;
  for (puVar17 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; (__node_base_ptr)puVar17 != local_40;
      puVar17 = puVar17 + 1) {
    _Var3._M_head_impl =
         (puVar17->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
         ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      name.str._M_str = pcVar15;
      name.str._M_len = (size_t)*(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x30);
      bVar9 = ABI::wasm2js::isHelper
                        (*(wasm2js **)
                          &((Name *)((long)&(_Var3._M_head_impl)->super_Importable + 0x28))->
                           super_IString,name);
      pcVar15 = extraout_RDX_00;
      if (!bVar9) {
        pNVar1 = (Name *)((long)&(_Var3._M_head_impl)->super_Importable + 0x18);
        sVar12 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_a0,pNVar1);
        pcVar15 = extraout_RDX_01;
        if (sVar12 == 0) {
          poVar11 = std::operator<<((ostream *)
                                    ((Output *)
                                     (local_38->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 0x200),"  \"");
          name_02.super_IString.str._M_str = (char *)_Var13._M_head_impl;
          name_02.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x20);
          poVar11 = wasm::operator<<((wasm *)poVar11,
                                     *(ostream **)
                                      &((Name *)((long)&(_Var3._M_head_impl)->super_Importable +
                                                0x18))->super_IString,name_02);
          poVar11 = std::operator<<(poVar11,"\": ");
          IString::toString_abi_cxx11_(&local_60,(IString *)pNVar1);
          ::wasm::asmangle(local_278,&local_60);
          poVar11 = std::operator<<(poVar11,local_278);
          std::operator<<(poVar11,",\n");
          std::__cxx11::string::~string(local_278);
          std::__cxx11::string::~string((string *)&local_60);
          _Var19 = std::__detail::
                   _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_a0,pNVar1);
          pcVar15 = _Var19._8_8_;
        }
      }
    }
  }
  pMVar4 = (Module *)
           (local_38->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (pMVar4->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar16 = (pMVar4->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar5; puVar16 = puVar16 + 1
      ) {
    _Var6._M_head_impl =
         (puVar16->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var6._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      name_00.str._M_str = pcVar15;
      name_00.str._M_len = (size_t)*(char **)((long)&(_Var6._M_head_impl)->super_Importable + 0x30);
      bVar9 = ABI::wasm2js::isHelper
                        (*(wasm2js **)
                          &((Name *)((long)&(_Var6._M_head_impl)->super_Importable + 0x28))->
                           super_IString,name_00);
      pcVar15 = extraout_RDX_02;
      if (!bVar9) {
        poVar11 = std::operator<<((ostream *)
                                  ((Output *)
                                   (local_38->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0x200),"  \"");
        name_03.super_IString.str._M_str = (char *)_Var13._M_head_impl;
        name_03.super_IString.str._M_len =
             (size_t)*(char **)((long)&(_Var6._M_head_impl)->super_Importable + 0x20);
        poVar11 = wasm::operator<<((wasm *)poVar11,
                                   *(ostream **)
                                    &((Name *)((long)&(_Var6._M_head_impl)->super_Importable + 0x18)
                                     )->super_IString,name_03);
        std::operator<<(poVar11,"\": {\n");
        poVar11 = std::operator<<((ostream *)
                                  ((Output *)
                                   (local_38->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0x200),"    ");
        IString::toString_abi_cxx11_
                  (&local_60,(IString *)((long)&(_Var6._M_head_impl)->super_Importable + 0x28));
        ::wasm::asmangle(local_278,&local_60);
        poVar11 = std::operator<<(poVar11,local_278);
        poVar11 = std::operator<<(poVar11,": { buffer : mem");
        _Var13._M_head_impl = (Memory *)local_38;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(char *)(local_38->globals).
                                             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(local_38->globals).
                                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
        std::operator<<(poVar11," }\n");
        std::__cxx11::string::~string(local_278);
        std::__cxx11::string::~string((string *)&local_60);
        std::operator<<((ostream *)
                        ((Output *)
                         (local_38->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 0x200),"  },\n");
        pcVar15 = extraout_RDX_03;
      }
    }
  }
  pMVar4 = (Module *)
           (local_38->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (__node_base_ptr)
             (pMVar4->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var14 = (__node_base_ptr)
                 (pMVar4->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pMVar4 = local_38, p_Var14 != local_40;
      p_Var14 = p_Var14 + 1) {
    pEVar7 = (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
              &p_Var14->_M_nxt)->
             super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
             super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (*(long *)&((Name *)&pEVar7->kind)->super_IString != 0) {
      name_01.str._M_str = pcVar15;
      name_01.str._M_len = *(size_t *)((long)(pEVar7 + 1) + 8);
      bVar9 = ABI::wasm2js::isHelper(*(wasm2js **)&pEVar7[1].name.super_IString,name_01);
      pcVar15 = extraout_RDX_04;
      if (!bVar9) {
        pNVar1 = (Name *)((long)&pEVar7->value + 8);
        sVar12 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_a0,pNVar1);
        pcVar15 = extraout_RDX_05;
        if (sVar12 == 0) {
          poVar11 = std::operator<<((ostream *)
                                    ((Output *)
                                     (local_38->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 0x200),"  \"");
          name_04.super_IString.str._M_str = (char *)_Var13._M_head_impl;
          name_04.super_IString.str._M_len = *(size_t *)&((Name *)&pEVar7->kind)->super_IString;
          poVar11 = wasm::operator<<((wasm *)poVar11,
                                     *(ostream **)
                                      &((Name *)((long)&pEVar7->value + 8))->super_IString,name_04);
          poVar11 = std::operator<<(poVar11,"\": ");
          IString::toString_abi_cxx11_(&local_60,(IString *)pNVar1);
          ::wasm::asmangle(local_278,&local_60);
          poVar11 = std::operator<<(poVar11,local_278);
          std::operator<<(poVar11,",\n");
          std::__cxx11::string::~string(local_278);
          std::__cxx11::string::~string((string *)&local_60);
          _Var19 = std::__detail::
                   _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_a0,pNVar1);
          pcVar15 = _Var19._8_8_;
        }
      }
    }
  }
  std::operator<<((ostream *)
                  ((Output *)
                   (local_38->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 0x200),"});\n");
  if (((Flags *)
      &(pMVar4->exports).
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage)->allowAsserts == false) {
    pMVar4 = (Module *)
             (local_38->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    seenModules._M_h._M_single_bucket =
         (__node_base_ptr)
         (pMVar4->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    p_Var14 = (__node_base_ptr)
              (pMVar4->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (p_Var14 != seenModules._M_h._M_single_bucket) {
      EVar2 = *(ExternalKind *)
               &((Name *)&((((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                              *)&p_Var14->_M_nxt)->
                           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>).
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                           .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind)->
                super_IString;
      local_40 = p_Var14;
      if (((uint)EVar2 < 4) && (EVar2 != Table)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        pEVar7 = (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
                  &local_40->_M_nxt)->
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        lVar8 = *(long *)&(pEVar7->name).super_IString;
        pcVar15 = *(char **)((long)&(pEVar7->name).super_IString + 8);
        for (lVar18 = 0; lVar8 != lVar18; lVar18 = lVar18 + 1) {
          cVar10 = pcVar15[lVar18];
          if (cVar10 == '-') {
            cVar10 = '_';
          }
          std::operator<<((ostream *)local_278,cVar10);
        }
        poVar11 = std::operator<<((ostream *)
                                  ((Output *)
                                   (local_38->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0x200),"export var "
                                 );
        IString::toString_abi_cxx11_
                  (&local_e0,
                   (IString *)
                   (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *
                     )&local_40->_M_nxt)->
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
        ::wasm::asmangle(&local_60,&local_e0);
        poVar11 = std::operator<<(poVar11,(string *)&local_60);
        poVar11 = std::operator<<(poVar11," = ret");
        name_05.super_IString.str._M_str = (char *)local_38;
        name_05.super_IString.str._M_len =
             (size_t)(local_38->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        poVar11 = wasm::operator<<((wasm *)poVar11,
                                   (ostream *)
                                   (local_38->globals).
                                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,name_05);
        poVar11 = std::operator<<(poVar11,".");
        IString::toString_abi_cxx11_
                  (&local_c0,
                   (IString *)
                   (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *
                     )&local_40->_M_nxt)->
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
        ::wasm::asmangle(local_100,&local_c0);
        poVar11 = std::operator<<(poVar11,local_100);
        std::operator<<(poVar11,";\n");
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
      }
      p_Var14 = local_40 + 1;
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_a0);
  return;
}

Assistant:

void Wasm2JSGlue::emitPostES6() {
  // Create an initial `ArrayBuffer` and populate it with static data.
  // Currently we use base64 encoding to encode static data and we decode it at
  // instantiation time.
  //
  // Note that the translation here expects that the lower values of this memory
  // can be used for conversions, so make sure there's at least one page.
  if (!wasm.memories.empty() && wasm.memories[0]->imported()) {
    out << "var mem" << moduleName.str << " = new ArrayBuffer("
        << wasm.memories[0]->initial.addr * Memory::kPageSize << ");\n";
  }

  // Actually invoke the `asmFunc` generated function, passing in all global
  // values followed by all imports
  out << "var ret" << moduleName.str << " = " << moduleName.str << "({\n";

  std::unordered_set<Name> seenModules;

  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  ModuleUtils::iterImportedMemories(wasm, [&](Memory* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    out << "  \"" << import->module << "\": {\n";
    out << "    " << asmangle(import->base.toString()) << ": { buffer : mem"
        << moduleName.str << " }\n";
    out << "  },\n";
  });

  ModuleUtils::iterImportedTables(wasm, [&](Table* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  out << "});\n";

  if (flags.allowAsserts) {
    return;
  }

  // And now that we have our returned instance, export all our functions
  // that are hanging off it.
  for (auto& exp : wasm.exports) {
    switch (exp->kind) {
      case ExternalKind::Function:
      case ExternalKind::Global:
      case ExternalKind::Memory:
        break;

      // Exported globals and function tables aren't supported yet
      default:
        continue;
    }
    std::ostringstream export_name;
    for (char c : exp->name.str) {
      if (c == '-') {
        export_name << '_';
      } else {
        export_name << c;
      }
    }
    out << "export var " << asmangle(exp->name.toString()) << " = ret"
        << moduleName << "." << asmangle(exp->name.toString()) << ";\n";
  }
}